

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

int __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
::init(DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
       *this,EVP_PKEY_CTX *ctx)

{
  fstream *file_;
  byte bVar1;
  int iVar2;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *pLVar3;
  byte in_CL;
  uint in_EDX;
  locType loc;
  ofstream outfile;
  ifstream infile;
  node tmp;
  
  pLVar3 = (this->
           super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
           ).cache;
  if (pLVar3 != (LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                 *)0x0) {
    LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ::~LRUCache(pLVar3);
    operator_delete(pLVar3,0x48);
  }
  pLVar3 = (LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            *)operator_new(0x48);
  file_ = &(this->
           super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
           ).file;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  ::LRUCache(pLVar3,(ulong)in_EDX,file_);
  (this->
  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  ).cache = pLVar3;
  std::ifstream::ifstream(&infile,(string *)ctx,_S_in);
  bVar1 = std::__basic_file<char>::is_open();
  if ((byte)(bVar1 ^ 1 | in_CL) == 1) {
    (this->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ).is_newfile = true;
    std::ofstream::ofstream(&outfile,(string *)ctx,_S_out|_S_bin);
    memset(&tmp,0,0x648);
    std::ostream::write((char *)&outfile,(long)&tmp);
    loc = 0x648;
    std::ostream::seekp((long)&outfile,0xfffff9b8);
    std::ostream::write((char *)&outfile,(long)&loc);
    std::ofstream::close();
    std::ofstream::~ofstream(&outfile);
  }
  else {
    (this->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    ).is_newfile = false;
  }
  std::ifstream::close();
  std::fstream::open((string *)file_,(_Ios_Openmode)ctx);
  iVar2 = std::ifstream::~ifstream(&infile);
  return iVar2;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				T tmp;
				outfile.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				locType loc = sizeof (T);
				outfile.seekp(- sizeof (T) , std::ios_base::cur) , outfile.write(reinterpret_cast<char *> (&loc) , sizeof (locType));
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}